

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [21],uint *Args_4,char (*Args_5) [43],uint *Args_6,
          char (*Args_7) [18],char **Args_8,char (*Args_9) [44])

{
  stringstream local_1d8 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [21];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [29];
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[21],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[44]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [21])Args_2,
             (uint *)Args_3,(char (*) [43])Args_4,(uint *)Args_5,(char (*) [18])Args_6,
             (char **)Args_7,(char (*) [44])Args_8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}